

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGenerator::InfoT::GetArray
          (InfoT *this,string *key,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *list,bool required)

{
  bool bVar1;
  byte local_101;
  cmAlphaNum local_c8;
  cmAlphaNum local_98;
  string local_68;
  string_view local_48;
  Value *local_38;
  Value *jval;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puStack_28;
  bool required_local;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *list_local;
  string *key_local;
  InfoT *this_local;
  
  jval._7_1_ = required;
  puStack_28 = list;
  list_local = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)key;
  key_local = (string *)this;
  local_38 = Json::Value::operator[](&this->Json_,key);
  bVar1 = Json::Value::isArray(local_38);
  if ((bVar1) || ((bVar1 = Json::Value::isNull(local_38), bVar1 && ((jval._7_1_ & 1) == 0)))) {
    bVar1 = GetJsonArray(puStack_28,local_38);
    local_101 = 1;
    if (!bVar1) {
      local_101 = jval._7_1_ ^ 0xff;
    }
    this_local._7_1_ = local_101 & 1;
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_98,(string *)list_local);
    cmAlphaNum::cmAlphaNum(&local_c8," is not an array.");
    cmStrCat<>(&local_68,&local_98,&local_c8);
    local_48 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_68);
    this_local._7_1_ = LogError(this,local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoGenerator::InfoT::GetArray(std::string const& key,
                                        std::unordered_set<std::string>& list,
                                        bool required) const
{
  Json::Value const& jval = this->Json_[key];
  if (!jval.isArray()) {
    if (!jval.isNull() || required) {
      return this->LogError(cmStrCat(key, " is not an array."));
    }
  }
  return GetJsonArray(list, jval) || !required;
}